

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagPrinterFancyCore.cpp
# Opt level: O0

void __thiscall
Mond::DiagPrinterFancyCore::PrintSev(DiagPrinterFancyCore *this,Diag *d,char *fmt,...)

{
  char in_AL;
  char *pcVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_4f8 [24];
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined4 local_448;
  undefined4 local_444;
  va_list ap;
  char local_428 [8];
  char buffer [1024];
  char *fmt_local;
  Diag *d_local;
  DiagPrinterFancyCore *this_local;
  
  if (in_AL != '\0') {
    local_4c8 = in_XMM0_Qa;
    local_4b8 = in_XMM1_Qa;
    local_4a8 = in_XMM2_Qa;
    local_498 = in_XMM3_Qa;
    local_488 = in_XMM4_Qa;
    local_478 = in_XMM5_Qa;
    local_468 = in_XMM6_Qa;
    local_458 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_4f8;
  ap[0]._0_8_ = &stack0x00000008;
  local_444 = 0x30;
  local_448 = 0x18;
  local_4e0 = in_RCX;
  local_4d8 = in_R8;
  local_4d0 = in_R9;
  vsnprintf(local_428,0x400,fmt,&local_448);
  printf("[");
  (**this->_vptr_DiagPrinterFancyCore)(this,(ulong)d->severity);
  pcVar1 = GetSeverityName(d->severity);
  printf("%s",pcVar1);
  (*this->_vptr_DiagPrinterFancyCore[1])();
  printf("] %s",local_428);
  return;
}

Assistant:

void DiagPrinterFancyCore::PrintSev(const Diag &d, const char *fmt, ...)
{
	char buffer[1024];

	va_list ap;
	va_start(ap, fmt);
	vsnprintf(buffer, 1024, fmt, ap);
	va_end(ap);

	printf("[");

	SetColor(d.severity);
	printf("%s", GetSeverityName(d.severity));
	ResetColor();

	printf("] %s", buffer);
}